

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O0

int __thiscall
CVmObjFrameDesc::getp_get_vars(CVmObjFrameDesc *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_obj_id_t obj;
  uint uVar2;
  int iVar3;
  CVmObjFrameRef *this_00;
  vm_val_t *in_RDX;
  vm_val_t *in_RDI;
  int parent;
  vm_val_t val;
  vm_val_t key;
  int i;
  int sym_cnt;
  CVmDbgFrameSymPtr sym;
  CVmDbgFramePtr dfp;
  CVmDbgTablePtr dp;
  vm_frameref_ext *fext;
  CVmObjFrameRef *fr;
  vm_framedesc_ext *ext;
  CVmObjLookupTable *tab;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  uint *in_stack_ffffffffffffff50;
  vm_val_t *this_01;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  vm_val_t *in_stack_ffffffffffffff68;
  CVmObjLookupTable *in_stack_ffffffffffffff70;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffff80;
  CVmObjFrameRef *in_stack_ffffffffffffff90;
  
  if ((getp_get_vars(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_get_vars(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_get_vars::desc,0);
    __cxa_guard_release(&getp_get_vars(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_RDI,in_stack_ffffffffffffff50,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (iVar1 == 0) {
    this_01 = in_RDX;
    obj = CVmObjLookupTable::create
                    ((int)((ulong)in_RDX >> 0x20),(uint)in_RDX,in_stack_ffffffffffffff4c);
    vm_val_t::set_obj(this_01,obj);
    vm_objp(0);
    get_ext((CVmObjFrameDesc *)in_RDI);
    this_00 = get_frame_ref((CVmObjFrameDesc *)0x352df7);
    CVmObjFrameRef::get_ext(this_00);
    iVar1 = CVmDbgTablePtr::set((CVmDbgTablePtr *)in_stack_ffffffffffffff68,
                                (uchar *)CONCAT44(in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60));
    if (iVar1 != 0) {
      CVmDbgTablePtr::set_frame_ptr
                ((CVmDbgTablePtr *)in_stack_ffffffffffffff70,
                 (CVmDbgFramePtr *)in_stack_ffffffffffffff68,
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      CVmStack::push(in_RDX);
      while( true ) {
        CVmDbgFramePtr::set_first_sym_ptr
                  ((CVmDbgFramePtr *)this_01,
                   (CVmDbgFrameSymPtr *)
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        uVar2 = CVmDbgFramePtr::get_sym_count((CVmDbgFramePtr *)0x352e71);
        iVar1 = 0;
        while (iVar1 < (int)uVar2) {
          CVmDbgFrameSymPtr::get_str_val
                    ((CVmDbgFrameSymPtr *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          CVmStack::push((vm_val_t *)&stack0xffffffffffffff78);
          iVar3 = CVmObjLookupTable::index_check
                            ((CVmObjLookupTable *)in_RDI,this_01,
                             (vm_val_t *)
                             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          if (iVar3 == 0) {
            CVmObjFrameRef::get_local_val
                      (in_stack_ffffffffffffff90,(vm_val_t *)CONCAT44(uVar2,iVar1),
                       (CVmDbgFrameSymPtr *)in_stack_ffffffffffffff80.native_desc);
            CVmObjLookupTable::add_entry
                      (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                       (vm_val_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
          }
          CVmStack::discard();
          iVar1 = iVar1 + 1;
          CVmDbgFrameSymPtr::inc((CVmDbgFrameSymPtr *)this_01);
        }
        in_stack_ffffffffffffff64 = CVmDbgFramePtr::get_enclosing_frame((CVmDbgFramePtr *)0x352f07);
        if (in_stack_ffffffffffffff64 == 0) break;
        CVmDbgTablePtr::set_frame_ptr
                  ((CVmDbgTablePtr *)in_stack_ffffffffffffff70,
                   (CVmDbgFramePtr *)in_stack_ffffffffffffff68,
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      }
      CVmStack::discard();
    }
  }
  return 1;
}

Assistant:

int CVmObjFrameDesc::getp_get_vars(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                   uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* create our lookup table object */
    retval->set_obj(CVmObjLookupTable::create(vmg_ FALSE, 32, 64));
    CVmObjLookupTable *tab = (CVmObjLookupTable *)
                             vm_objp(vmg_ retval->val.obj);

    /* get our extension */
    vm_framedesc_ext *ext = get_ext();

    /* get our underlying frame ref and its extension */
    CVmObjFrameRef *fr = get_frame_ref(vmg0_);
    vm_frameref_ext *fext = fr->get_ext();

    /* set up pointer to this method's debug records */
    CVmDbgTablePtr dp;
    if (!dp.set(fext->entryp))
        return TRUE;

    /* set up a pointer to our frame */
    CVmDbgFramePtr dfp;
    dp.set_frame_ptr(vmg_ &dfp, ext->frame_idx);

    /* push the table for gc protection */
    G_stk->push(retval);

    /* walk up the list of frames from innermost to outermost */
    for (;;)
    {
        /* set up a pointer to the first symbol */
        CVmDbgFrameSymPtr sym;
        dfp.set_first_sym_ptr(vmg_ &sym);

        /* scan this frame's local symbol list */
        int sym_cnt = dfp.get_sym_count();
        for (int i = 0 ; i < sym_cnt ; ++i, sym.inc(vmg0_))
        {
            /* set up a string value for the key */
            vm_val_t key;
            sym.get_str_val(vmg_ &key);
            G_stk->push(&key);

            /* 
             *   If this entry isn't already in the table, add it.  Don't
             *   bother if it already exists: we work from inner to outer
             *   scopes, and inner scopes hide things in outer scopes, so if
             *   we find an entry in the table already it means that it was
             *   an inner-scope entry that hides the one we're processing
             *   now.  
             */
            vm_val_t val;
            if (!tab->index_check(vmg_ &val, &key))
            {
                /* get the value */
                fr->get_local_val(vmg_ &val, &sym);
                
                /* add the entry to the table */
                tab->add_entry(vmg_ &key, &val);
            }

            /* done with the key for gc protection */
            G_stk->discard();
        }

        /* move up to the enclosing frame */
        int parent = dfp.get_enclosing_frame();
        if (parent == 0)
            break;

        /* set up dfp to point to the parent fraem */
        dp.set_frame_ptr(vmg_ &dfp, parent);
    }

    /* discard the table ref we pushed for gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}